

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                 e)

{
  Precedence PVar1;
  char *__s;
  BasicWriter<char> *pBVar2;
  size_t sVar3;
  Precedence precedence;
  BasicStringRef<char> value;
  
  PVar1 = mp::expr::PrecInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_];
  precedence = UNARY;
  if (PVar1 != EXPONENTIATION) {
    precedence = PVar1;
  }
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(LogicalExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                       impl_ + 8))->impl_,precedence);
  pBVar2 = fmt::BasicWriter<char>::operator<<(*(BasicWriter<char> **)(this + 8),' ');
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_].
        str;
  sVar3 = strlen(__s);
  value.size_ = sVar3;
  value.data_ = __s;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(LogicalExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                       impl_ + 0x10))->impl_,(PVar1 != EXPONENTIATION) + PVar1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}